

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_21ff5::open_input_stream(anon_unknown_dwarf_21ff5 *this,char *filename)

{
  long lVar1;
  
  std::ifstream::ifstream(this);
  lVar1 = *(long *)(*(long *)this + -0x18);
  *(undefined4 *)(this + lVar1 + 0x1c) = 7;
  std::ios::clear((int)this + (int)lVar1);
  std::ifstream::open((char *)this,(_Ios_Openmode)filename);
  return;
}

Assistant:

ifstream open_input_stream(const char* filename)
{
    ifstream stream;
    stream.exceptions(ios::eofbit | ios::failbit | ios::badbit);
    stream.open(filename, mode_input);

    return stream;
}